

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# httplib.h
# Opt level: O0

string * httplib::detail::encode_query_param(string *__return_storage_ptr__,string *value)

{
  byte bVar1;
  bool bVar2;
  int iVar3;
  _Setw _Var4;
  byte *pbVar5;
  ostream *poVar6;
  const_iterator cStack_1b8;
  char c;
  const_iterator __end2;
  const_iterator __begin2;
  string *__range2;
  long local_190;
  ostringstream escaped;
  string *value_local;
  
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_190);
  std::ios::fill((char)&local_190 + (char)*(undefined8 *)(local_190 + -0x18));
  std::ostream::operator<<(&local_190,std::hex);
  __end2 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::begin
                     (value);
  cStack_1b8 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::end
                         (value);
  while( true ) {
    bVar2 = __gnu_cxx::
            operator==<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      (&__end2,&stack0xfffffffffffffe48);
    if (((bVar2 ^ 0xffU) & 1) == 0) break;
    pbVar5 = (byte *)__gnu_cxx::
                     __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     ::operator*(&__end2);
    bVar1 = *pbVar5;
    iVar3 = isalnum((uint)bVar1);
    if ((((((iVar3 == 0) && (bVar1 != 0x2d)) && (bVar1 != 0x5f)) &&
         ((bVar1 != 0x2e && (bVar1 != 0x21)))) &&
        ((bVar1 != 0x7e && ((bVar1 != 0x2a && (bVar1 != 0x27)))))) &&
       ((bVar1 != 0x28 && (bVar1 != 0x29)))) {
      std::ostream::operator<<(&local_190,std::uppercase);
      poVar6 = std::operator<<((ostream *)&local_190,'%');
      _Var4 = std::setw(2);
      poVar6 = std::operator<<(poVar6,_Var4);
      std::ostream::operator<<(poVar6,(uint)bVar1);
      std::ostream::operator<<(&local_190,std::nouppercase);
    }
    else {
      std::operator<<((ostream *)&local_190,bVar1);
    }
    __gnu_cxx::
    __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator++(&__end2);
  }
  std::__cxx11::ostringstream::str();
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_190);
  return __return_storage_ptr__;
}

Assistant:

inline std::string encode_query_param(const std::string &value) {
  std::ostringstream escaped;
  escaped.fill('0');
  escaped << std::hex;

  for (auto c : value) {
    if (std::isalnum(static_cast<uint8_t>(c)) || c == '-' || c == '_' ||
        c == '.' || c == '!' || c == '~' || c == '*' || c == '\'' || c == '(' ||
        c == ')') {
      escaped << c;
    } else {
      escaped << std::uppercase;
      escaped << '%' << std::setw(2)
              << static_cast<int>(static_cast<unsigned char>(c));
      escaped << std::nouppercase;
    }
  }

  return escaped.str();
}